

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-bind.h
# Opt level: O3

CommandReturnType1<dynamicgraph::CustomEntity,_int,_int> * __thiscall
dynamicgraph::command::CommandReturnType1<dynamicgraph::CustomEntity,_int,_int>::doExecute
          (CommandReturnType1<dynamicgraph::CustomEntity,_int,_int> *this)

{
  int iVar1;
  long *plVar2;
  long in_RSI;
  int val;
  result_type local_30 [3];
  int local_24;
  
  plVar2 = (long *)dynamicgraph::command::Command::getParameterValues();
  if (plVar2[1] - *plVar2 == 0x10) {
    dynamicgraph::command::Command::getParameterValues();
    dynamicgraph::command::Value::value();
    iVar1 = dynamicgraph::command::EitherType::operator_cast_to_int((EitherType *)local_30);
    dynamicgraph::command::EitherType::~EitherType((EitherType *)local_30);
    local_24 = iVar1;
    local_30[0] = boost::function1<int,_const_int_&>::operator()
                            ((function1<int,_const_int_&> *)(in_RSI + 0x60),&local_24);
    dynamicgraph::command::Value::Value((Value *)this,local_30);
    return this;
  }
  __assert_fail("getParameterValues().size() == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/include/dynamic-graph/command-bind.h"
                ,0x334,
                "virtual Value dynamicgraph::command::CommandReturnType1<dynamicgraph::CustomEntity, int, int>::doExecute() [E = dynamicgraph::CustomEntity, ReturnType = int, T = int]"
               );
}

Assistant:

virtual Value doExecute() {
    assert(getParameterValues().size() == 1);
    T val = getParameterValues()[0].value();
    Value res(fptr(val));
    return res;
  }